

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSPI_PDU.cpp
# Opt level: O2

void __thiscall KDIS::PDU::TSPI_PDU::SetPositionError(TSPI_PDU *this,PositionError *PE)

{
  SetPositionErrorFlag(this,true);
  DATA_TYPE::PositionError::operator=(&this->m_PosErr,PE);
  return;
}

Assistant:

void TSPI_PDU::SetPositionError( const PositionError & PE )
{
    SetPositionErrorFlag( true );
    m_PosErr = PE;
}